

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_direct.cpp
# Opt level: O2

void __thiscall
direct_solvers_lower_upper_factorisation_initialise_Test::
direct_solvers_lower_upper_factorisation_initialise_Test
          (direct_solvers_lower_upper_factorisation_initialise_Test *this)

{
  direct_solvers::direct_solvers(&this->super_direct_solvers);
  (this->super_direct_solvers).super_Test._vptr_Test = (_func_int **)&PTR__direct_solvers_0014b8f0;
  return;
}

Assistant:

TEST_F(direct_solvers, lower_upper_factorisation_initialise) {

  Solver_Config data;
  data.type = Solver_Type::lower_upper_factorisation;
  data.factor_tolerance = 5.0;
  data.pivot = false;

  lu_solver.initialise(data);
  auto lu_data = lu_solver.get_config();
  EXPECT_EQ(lu_data.type, Solver_Type::lower_upper_factorisation);
  EXPECT_EQ(lu_data.pivot, false);
  EXPECT_EQ(lu_data.factor_tolerance, data.factor_tolerance);

  data.pivot = true;
  lup_solver.initialise(data);
  auto lup_data = lup_solver.get_config();
  EXPECT_EQ(lup_data.type, Solver_Type::lower_upper_factorisation);
  EXPECT_EQ(lup_data.pivot, true);
  EXPECT_EQ(lup_data.factor_tolerance, data.factor_tolerance);
}